

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_huffman_code_lengths(uint *lengths,uint *frequencies,size_t numcodes,uint maxbitlen)

{
  ulong uVar1;
  BPMNode *pBVar2;
  BPMNode *pBVar3;
  BPMNode *pBVar4;
  undefined4 uVar5;
  BPMNode **__ptr;
  bool bVar6;
  uint uVar7;
  int iVar8;
  size_t i;
  BPMNode *leaves;
  long lVar9;
  BPMNode *pBVar10;
  ulong uVar11;
  ulong uVar12;
  BPMNode **__ptr_00;
  BPMNode **ppBVar13;
  ulong uVar14;
  BPMNode *pBVar15;
  BPMNode *pBVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  BPMLists lists;
  
  if ((uint)(1 << ((byte)maxbitlen & 0x1f)) < (uint)numcodes || numcodes == 0) {
    return 0x50;
  }
  leaves = (BPMNode *)malloc(numcodes * 0x18);
  if (leaves == (BPMNode *)0x0) {
    return 0x53;
  }
  uVar20 = 0;
  for (uVar7 = 0; uVar7 != numcodes; uVar7 = uVar7 + 1) {
    if (frequencies[uVar7] != 0) {
      leaves[uVar20].weight = frequencies[uVar7];
      leaves[uVar20].index = uVar7;
      uVar20 = uVar20 + 1;
    }
  }
  for (lVar9 = 0; numcodes << 2 != lVar9; lVar9 = lVar9 + 1) {
    *(undefined1 *)((long)lengths + lVar9) = 0;
  }
  if (uVar20 == 1) {
    uVar7 = leaves->index;
    lengths[uVar7] = 1;
    lengths[(ulong)uVar7 == 0] = 1;
  }
  else {
    if (uVar20 != 0) {
      pBVar10 = (BPMNode *)malloc(uVar20 * 0x18);
      bVar6 = false;
      uVar14 = 1;
      while (uVar14 < uVar20) {
        pBVar15 = leaves;
        pBVar4 = pBVar10;
        if (!bVar6) {
          pBVar15 = pBVar10;
          pBVar4 = leaves;
        }
        uVar17 = 0;
        while (uVar17 < uVar20) {
          uVar21 = uVar17 + uVar14;
          if (uVar20 <= uVar17 + uVar14) {
            uVar21 = uVar20;
          }
          uVar1 = uVar17 + uVar14 * 2;
          uVar11 = uVar21;
          pBVar16 = pBVar15;
          uVar18 = uVar17;
          uVar22 = uVar20;
          if (uVar1 < uVar20) {
            uVar22 = uVar1;
          }
          for (; uVar17 < uVar22; uVar17 = uVar17 + 1) {
            if ((uVar18 < uVar21) &&
               ((uVar22 <= uVar11 || (pBVar4[uVar18].weight <= pBVar4[uVar11].weight)))) {
              uVar19 = uVar18 + 1;
              uVar12 = uVar11;
            }
            else {
              uVar12 = uVar11 + 1;
              uVar19 = uVar18;
              uVar18 = uVar11;
            }
            uVar5 = *(undefined4 *)&pBVar4[uVar18].field_0x14;
            pBVar16->in_use = pBVar4[uVar18].in_use;
            *(undefined4 *)&pBVar16->field_0x14 = uVar5;
            pBVar2 = pBVar4 + uVar18;
            uVar7 = pBVar2->index;
            pBVar3 = pBVar2->tail;
            pBVar16->weight = pBVar2->weight;
            pBVar16->index = uVar7;
            pBVar16->tail = pBVar3;
            uVar11 = uVar12;
            pBVar16 = pBVar16 + 1;
            uVar18 = uVar19;
          }
          pBVar15 = pBVar15 + uVar14 * 2;
          uVar17 = uVar1;
        }
        bVar6 = (bool)(bVar6 ^ 1);
        uVar14 = uVar14 * 2;
      }
      if (bVar6) {
        lodepng_memcpy(leaves,pBVar10,uVar20 * 0x18);
      }
      free(pBVar10);
      lists.memsize = (maxbitlen + 1) * maxbitlen * 2;
      uVar14 = (ulong)lists.memsize;
      lists.nextfree = 0;
      lists.numfree = lists.memsize;
      lists.listsize = maxbitlen;
      pBVar10 = (BPMNode *)malloc(uVar14 * 0x18);
      lists.memory = pBVar10;
      __ptr_00 = (BPMNode **)malloc(uVar14 * 8);
      lists.freelist = __ptr_00;
      ppBVar13 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      lists.chains0 = ppBVar13;
      lists.chains1 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      auVar23._0_4_ = -(uint)((int)((ulong)pBVar10 >> 0x20) == 0 && (int)pBVar10 == 0);
      auVar23._4_4_ = -(uint)((int)__ptr_00 == 0 && (int)((ulong)__ptr_00 >> 0x20) == 0);
      auVar23._8_4_ = -(uint)((int)((ulong)ppBVar13 >> 0x20) == 0 && (int)ppBVar13 == 0);
      auVar23._12_4_ = -(uint)((int)lists.chains1 == 0 && (int)((ulong)lists.chains1 >> 0x20) == 0);
      iVar8 = movmskps((int)lists.chains1,auVar23);
      uVar7 = 0x53;
      if (iVar8 == 0) {
        for (uVar17 = 0; uVar14 != uVar17; uVar17 = uVar17 + 1) {
          __ptr_00[uVar17] = pBVar10;
          pBVar10 = pBVar10 + 1;
        }
        bpmnode_create(&lists,leaves->weight,1,(BPMNode *)0x0);
        uVar14 = 2;
        bpmnode_create(&lists,leaves[1].weight,2,(BPMNode *)0x0);
        for (uVar17 = 0; lists.listsize != uVar17; uVar17 = uVar17 + 1) {
          lists.chains0[uVar17] = lists.memory;
          lists.chains1[uVar17] = lists.memory + 1;
        }
        for (; uVar20 * 2 - 2 != uVar14; uVar14 = (ulong)((int)uVar14 + 1)) {
          boundaryPM(&lists,leaves,uVar20,maxbitlen - 1,(int)uVar14);
        }
        ppBVar13 = lists.chains1 + (maxbitlen - 1);
        while (pBVar10 = *ppBVar13, pBVar10 != (BPMNode *)0x0) {
          for (uVar20 = 0; (uint)uVar20 != pBVar10->index; uVar20 = (ulong)((uint)uVar20 + 1)) {
            lengths[leaves[uVar20].index] = lengths[leaves[uVar20].index] + 1;
          }
          ppBVar13 = &pBVar10->tail;
        }
        uVar7 = 0;
        ppBVar13 = lists.chains0;
        pBVar10 = lists.memory;
        __ptr_00 = lists.freelist;
      }
      __ptr = lists.chains1;
      free(pBVar10);
      free(__ptr_00);
      free(ppBVar13);
      free(__ptr);
      goto LAB_00116dfd;
    }
    lengths[0] = 1;
    lengths[1] = 1;
  }
  uVar7 = 0;
LAB_00116dfd:
  free(leaves);
  return uVar7;
}

Assistant:

unsigned lodepng_huffman_code_lengths(unsigned* lengths, const unsigned* frequencies,
                                      size_t numcodes, unsigned maxbitlen) {
  unsigned error = 0;
  unsigned i;
  size_t numpresent = 0; /*number of symbols with non-zero frequency*/
  BPMNode* leaves; /*the symbols, only those with > 0 frequency*/

  if(numcodes == 0) return 80; /*error: a tree of 0 symbols is not supposed to be made*/
  if((1u << maxbitlen) < (unsigned)numcodes) return 80; /*error: represent all symbols*/

  leaves = (BPMNode*)lodepng_malloc(numcodes * sizeof(*leaves));
  if(!leaves) return 83; /*alloc fail*/

  for(i = 0; i != numcodes; ++i) {
    if(frequencies[i] > 0) {
      leaves[numpresent].weight = (int)frequencies[i];
      leaves[numpresent].index = i;
      ++numpresent;
    }
  }

  lodepng_memset(lengths, 0, numcodes * sizeof(*lengths));

  /*ensure at least two present symbols. There should be at least one symbol
  according to RFC 1951 section 3.2.7. Some decoders incorrectly require two. To
  make these work as well ensure there are at least two symbols. The
  Package-Merge code below also doesn't work correctly if there's only one
  symbol, it'd give it the theoretical 0 bits but in practice zlib wants 1 bit*/
  if(numpresent == 0) {
    lengths[0] = lengths[1] = 1; /*note that for RFC 1951 section 3.2.7, only lengths[0] = 1 is needed*/
  } else if(numpresent == 1) {
    lengths[leaves[0].index] = 1;
    lengths[leaves[0].index == 0 ? 1 : 0] = 1;
  } else {
    BPMLists lists;
    BPMNode* node;

    bpmnode_sort(leaves, numpresent);

    lists.listsize = maxbitlen;
    lists.memsize = 2 * maxbitlen * (maxbitlen + 1);
    lists.nextfree = 0;
    lists.numfree = lists.memsize;
    lists.memory = (BPMNode*)lodepng_malloc(lists.memsize * sizeof(*lists.memory));
    lists.freelist = (BPMNode**)lodepng_malloc(lists.memsize * sizeof(BPMNode*));
    lists.chains0 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    lists.chains1 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    if(!lists.memory || !lists.freelist || !lists.chains0 || !lists.chains1) error = 83; /*alloc fail*/

    if(!error) {
      for(i = 0; i != lists.memsize; ++i) lists.freelist[i] = &lists.memory[i];

      bpmnode_create(&lists, leaves[0].weight, 1, 0);
      bpmnode_create(&lists, leaves[1].weight, 2, 0);

      for(i = 0; i != lists.listsize; ++i) {
        lists.chains0[i] = &lists.memory[0];
        lists.chains1[i] = &lists.memory[1];
      }

      /*each boundaryPM call adds one chain to the last list, and we need 2 * numpresent - 2 chains.*/
      for(i = 2; i != 2 * numpresent - 2; ++i) boundaryPM(&lists, leaves, numpresent, (int)maxbitlen - 1, (int)i);

      for(node = lists.chains1[maxbitlen - 1]; node; node = node->tail) {
        for(i = 0; i != node->index; ++i) ++lengths[leaves[i].index];
      }
    }

    lodepng_free(lists.memory);
    lodepng_free(lists.freelist);
    lodepng_free(lists.chains0);
    lodepng_free(lists.chains1);
  }

  lodepng_free(leaves);
  return error;
}